

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

int av1_obmc_full_pixel_search
              (FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int step_param,
              FULLPEL_MV *best_mv)

{
  byte bVar1;
  MV_COST_TYPE MVar2;
  short sVar3;
  short sVar4;
  buf_2d *pbVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  MV *pMVar12;
  aom_variance_fn_ptr_t *paVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  int best_site;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  int j;
  ulong uVar21;
  undefined1 auVar22 [16];
  short sVar23;
  short sVar25;
  FULLPEL_MV FVar24;
  FULLPEL_MV tmp_mv;
  FULLPEL_MV local_88;
  int local_84;
  aom_variance_fn_ptr_t *local_80;
  uint local_74;
  int32_t *local_70;
  buf_2d *local_68;
  int local_5c;
  undefined1 local_58 [16];
  ulong local_40;
  int32_t *local_38;
  
  if (ms_params->fast_obmc_search == 0) {
    local_58._0_8_ = ms_params->search_sites;
    local_84 = 0;
    iVar9 = obmc_diamond_search_sad(ms_params,start_mv,&local_88,step_param,&local_5c);
    paVar13 = (aom_variance_fn_ptr_t *)0x7fffffff;
    if (iVar9 != 0x7fffffff) {
      iVar7 = (int)local_88.row;
      iVar6 = (int)local_88.col;
      pbVar5 = (ms_params->ms_buffers).ref;
      iVar9 = pbVar5->stride;
      uVar20 = (*ms_params->vfp->ovf)
                         (pbVar5->buf + (iVar9 * iVar7 + iVar6),iVar9,(ms_params->ms_buffers).wsrc,
                          (ms_params->ms_buffers).obmc_mask,&local_74);
      MVar2 = (ms_params->mv_cost_params).mv_cost_type;
      iVar9 = 0;
      if (MVar2 != '\x04') {
        pMVar12 = (ms_params->mv_cost_params).ref_mv;
        sVar23 = pMVar12->row;
        sVar25 = pMVar12->col;
        sVar3 = (short)(iVar7 << 3);
        sVar14 = sVar3 - sVar23;
        sVar4 = (short)(iVar6 << 3);
        sVar16 = sVar4 - sVar25;
        sVar15 = -sVar14;
        if (0 < sVar14) {
          sVar15 = sVar14;
        }
        sVar17 = -sVar16;
        if (0 < sVar16) {
          sVar17 = sVar16;
        }
        if (MVar2 == '\x03') {
          iVar9 = (int)sVar17 + (int)sVar15 >> 3;
        }
        else if (MVar2 == '\x01') {
          iVar9 = (int)sVar17 + (int)sVar15 >> 2;
        }
        else if (MVar2 == '\0') {
          local_80 = (aom_variance_fn_ptr_t *)(long)(ms_params->mv_cost_params).error_per_bit;
          iVar9 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar16] +
                         (long)(ms_params->mv_cost_params).mvcost[0][sVar14] +
                        (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                      (ulong)((uint)(sVar4 != sVar25) * 4 +
                                             (uint)(sVar3 != sVar23) * 8))) * (long)local_80 +
                        0x2000U >> 0xe);
        }
      }
      paVar13 = (aom_variance_fn_ptr_t *)(ulong)(iVar9 + uVar20);
    }
    *best_mv = local_88;
    iVar9 = ~step_param + *(int *)(local_58._0_8_ + 0xbb0);
    if (local_5c < iVar9) {
      uVar18 = CONCAT44(0,step_param + 1);
      local_68 = (buf_2d *)CONCAT44(local_68._4_4_,start_mv);
      local_58._0_8_ = uVar18;
      iVar6 = local_5c;
      do {
        if (local_84 == 0) {
          iVar7 = obmc_diamond_search_sad
                            (ms_params,start_mv,&local_88,(int)uVar18 + iVar6,&local_84);
          if (iVar7 == 0x7fffffff) {
            uVar18 = local_58._0_8_;
          }
          else {
            iVar11 = (int)local_88.row;
            iVar19 = (int)local_88.col;
            pbVar5 = (ms_params->ms_buffers).ref;
            iVar7 = pbVar5->stride;
            local_80 = paVar13;
            uVar20 = (*ms_params->vfp->ovf)
                               (pbVar5->buf + (iVar7 * iVar11 + iVar19),iVar7,
                                (ms_params->ms_buffers).wsrc,(ms_params->ms_buffers).obmc_mask,
                                &local_74);
            MVar2 = (ms_params->mv_cost_params).mv_cost_type;
            iVar7 = 0;
            if (MVar2 != '\x04') {
              pMVar12 = (ms_params->mv_cost_params).ref_mv;
              sVar23 = pMVar12->row;
              sVar25 = pMVar12->col;
              sVar3 = (short)(iVar11 << 3);
              sVar14 = sVar3 - sVar23;
              sVar4 = (short)(iVar19 << 3);
              sVar16 = sVar4 - sVar25;
              sVar15 = -sVar14;
              if (0 < sVar14) {
                sVar15 = sVar14;
              }
              sVar17 = -sVar16;
              if (0 < sVar16) {
                sVar17 = sVar16;
              }
              if (MVar2 == '\x03') {
                iVar7 = (int)sVar17 + (int)sVar15 >> 3;
              }
              else if (MVar2 == '\x01') {
                iVar7 = (int)sVar17 + (int)sVar15 >> 2;
              }
              else if (MVar2 == '\0') {
                local_70 = (int32_t *)(long)(ms_params->mv_cost_params).error_per_bit;
                iVar7 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar16] +
                               (long)(ms_params->mv_cost_params).mvcost[0][sVar14] +
                              (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                            (ulong)((uint)(sVar4 != sVar25) * 4 +
                                                   (uint)(sVar3 != sVar23) * 8))) * (long)local_70 +
                              0x2000U >> 0xe);
              }
            }
            uVar18 = local_58._0_8_;
            paVar13 = local_80;
            start_mv = local_68._0_4_;
            if ((int)(iVar7 + uVar20) < (int)local_80) {
              *best_mv = local_88;
              paVar13 = (aom_variance_fn_ptr_t *)(ulong)(iVar7 + uVar20);
            }
          }
        }
        else {
          local_84 = local_84 + -1;
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < iVar9);
    }
  }
  else {
    *best_mv = start_mv;
    iVar6 = (int)start_mv >> 0x10;
    iVar9 = (ms_params->mv_limits).col_max;
    if (iVar6 < iVar9) {
      iVar9 = iVar6;
    }
    iVar7 = (ms_params->mv_limits).col_min;
    sVar23 = (short)iVar9;
    if (iVar6 < iVar7) {
      sVar23 = (short)iVar7;
    }
    best_mv->col = sVar23;
    iVar7 = (int)start_mv.row;
    iVar9 = (ms_params->mv_limits).row_min;
    iVar6 = (ms_params->mv_limits).row_max;
    if (iVar7 < iVar6) {
      iVar6 = iVar7;
    }
    sVar25 = (short)iVar6;
    if (iVar7 < iVar9) {
      sVar25 = (short)iVar9;
    }
    best_mv->row = sVar25;
    local_80 = ms_params->vfp;
    local_68 = (ms_params->ms_buffers).ref;
    local_70 = (ms_params->ms_buffers).wsrc;
    local_38 = (ms_params->ms_buffers).obmc_mask;
    uVar8 = (*local_80->osdf)(local_68->buf + ((int)sVar23 + (int)sVar25 * local_68->stride),
                              local_68->stride,local_70,local_38);
    bVar1 = (ms_params->mv_cost_params).mv_cost_type;
    local_40 = 0;
    uVar20 = 0;
    if (bVar1 < 4) {
      FVar24 = (ms_params->mv_cost_params).full_ref_mv;
      auVar22 = psllw(ZEXT416(CONCAT22((*best_mv).col - FVar24.col,(*best_mv).row - FVar24.row)),3);
      sVar23 = auVar22._0_2_;
      sVar25 = auVar22._2_2_;
      switch(bVar1) {
      case 0:
        uVar20 = ((ms_params->mv_cost_params).mvcost[0][sVar23] +
                  *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                          (ulong)((uint)(sVar25 != 0) * 4 + (uint)(sVar23 != 0) * 8)) +
                 (ms_params->mv_cost_params).mvcost[1][sVar25]) *
                 (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
        break;
      case 1:
        sVar3 = -sVar23;
        sVar4 = -sVar25;
        uVar20 = ((uint)(ushort)((ushort)(sVar4 < sVar25) * sVar25 |
                                (ushort)(sVar4 >= sVar25) * sVar4) +
                 (uint)(ushort)((ushort)(sVar3 < sVar23) * sVar23 |
                               (ushort)(sVar3 >= sVar23) * sVar3)) * 4;
        break;
      case 2:
        sVar3 = -sVar23;
        sVar4 = -sVar25;
        uVar20 = ((uint)(ushort)((ushort)(sVar4 < sVar25) * sVar25 |
                                (ushort)(sVar4 >= sVar25) * sVar4) +
                 (uint)(ushort)((ushort)(sVar3 < sVar23) * sVar23 |
                               (ushort)(sVar3 >= sVar23) * sVar3)) * 0xf >> 3;
        break;
      case 3:
        sVar3 = -sVar23;
        sVar4 = -sVar25;
        uVar20 = (uint)(ushort)((ushort)(sVar4 < sVar25) * sVar25 |
                               (ushort)(sVar4 >= sVar25) * sVar4) +
                 (uint)(ushort)((ushort)(sVar3 < sVar23) * sVar23 |
                               (ushort)(sVar3 >= sVar23) * sVar3);
      }
    }
    uVar20 = uVar20 + uVar8;
    do {
      pMVar12 = av1_int_pro_motion_estimation::search_pos;
      uVar18 = 0xffffffff;
      uVar21 = 0;
      do {
        sVar23 = (*pMVar12).row + (*best_mv).row;
        sVar25 = (*pMVar12).col + (*best_mv).col;
        iVar9 = (int)sVar25;
        if (((((ms_params->mv_limits).col_min <= iVar9) && (iVar9 <= (ms_params->mv_limits).col_max)
             ) && (iVar6 = (int)sVar23, (ms_params->mv_limits).row_min <= iVar6)) &&
           ((iVar6 <= (ms_params->mv_limits).row_max &&
            (local_58 = ZEXT416(CONCAT22(sVar25,sVar23)),
            uVar8 = (*local_80->osdf)(local_68->buf + (iVar6 * local_68->stride + iVar9),
                                      local_68->stride,local_70,local_38), uVar8 < uVar20)))) {
          bVar1 = (ms_params->mv_cost_params).mv_cost_type;
          if (bVar1 < 4) {
            FVar24 = (ms_params->mv_cost_params).full_ref_mv;
            auVar22._0_2_ = local_58._0_2_ - FVar24.row;
            auVar22._2_2_ = local_58._2_2_ - FVar24.col;
            auVar22._4_2_ = local_58._4_2_;
            auVar22._6_2_ = local_58._6_2_;
            auVar22._8_2_ = local_58._8_2_;
            auVar22._10_2_ = local_58._10_2_;
            auVar22._12_2_ = local_58._12_2_;
            auVar22._14_2_ = local_58._14_2_;
            auVar22 = psllw(auVar22,3);
            sVar23 = auVar22._0_2_;
            sVar25 = auVar22._2_2_;
            switch(bVar1) {
            case 0:
              uVar10 = ((ms_params->mv_cost_params).mvcost[0][sVar23] +
                        *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                (ulong)((uint)(sVar25 != 0) * 4 + (uint)(sVar23 != 0) * 8)) +
                       (ms_params->mv_cost_params).mvcost[1][sVar25]) *
                       (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
              break;
            case 1:
              sVar3 = -sVar23;
              sVar4 = -sVar25;
              uVar10 = ((uint)(ushort)((ushort)(sVar4 < sVar25) * sVar25 |
                                      (ushort)(sVar4 >= sVar25) * sVar4) +
                       (uint)(ushort)((ushort)(sVar3 < sVar23) * sVar23 |
                                     (ushort)(sVar3 >= sVar23) * sVar3)) * 4;
              break;
            case 2:
              sVar3 = -sVar23;
              sVar4 = -sVar25;
              uVar10 = ((uint)(ushort)((ushort)(sVar4 < sVar25) * sVar25 |
                                      (ushort)(sVar4 >= sVar25) * sVar4) +
                       (uint)(ushort)((ushort)(sVar3 < sVar23) * sVar23 |
                                     (ushort)(sVar3 >= sVar23) * sVar3)) * 0xf >> 3;
              break;
            case 3:
              sVar3 = -sVar23;
              sVar4 = -sVar25;
              uVar10 = (uint)(ushort)((ushort)(sVar4 < sVar25) * sVar25 |
                                     (ushort)(sVar4 >= sVar25) * sVar4) +
                       (uint)(ushort)((ushort)(sVar3 < sVar23) * sVar23 |
                                     (ushort)(sVar3 >= sVar23) * sVar3);
            }
          }
          else {
            uVar10 = 0;
          }
          if (uVar10 + uVar8 < uVar20) {
            uVar18 = uVar21 & 0xffffffff;
            uVar20 = uVar10 + uVar8;
          }
        }
        uVar21 = uVar21 + 1;
        pMVar12 = pMVar12 + 1;
      } while (uVar21 != 4);
      if ((int)uVar18 == -1) break;
      FVar24.row = (*best_mv).row + av1_int_pro_motion_estimation::search_pos[(int)uVar18].row;
      FVar24.col = (*best_mv).col + av1_int_pro_motion_estimation::search_pos[(int)uVar18].col;
      *best_mv = FVar24;
      uVar8 = (int)local_40 + 1;
      local_40 = (ulong)uVar8;
    } while (uVar8 != 8);
    paVar13 = (aom_variance_fn_ptr_t *)0x7fffffff;
    if (uVar20 != 0x7fffffff) {
      sVar23 = best_mv->row;
      sVar25 = best_mv->col;
      pbVar5 = (ms_params->ms_buffers).ref;
      iVar9 = pbVar5->stride;
      uVar20 = (*ms_params->vfp->ovf)
                         (pbVar5->buf + (iVar9 * sVar23 + (int)sVar25),iVar9,
                          (ms_params->ms_buffers).wsrc,(ms_params->ms_buffers).obmc_mask,&local_74);
      MVar2 = (ms_params->mv_cost_params).mv_cost_type;
      iVar9 = 0;
      if (MVar2 != '\x04') {
        pMVar12 = (ms_params->mv_cost_params).ref_mv;
        sVar3 = pMVar12->row;
        sVar4 = pMVar12->col;
        sVar23 = (short)((int)sVar23 << 3);
        sVar14 = sVar23 - sVar3;
        sVar25 = (short)((int)sVar25 << 3);
        sVar16 = sVar25 - sVar4;
        sVar15 = -sVar14;
        if (0 < sVar14) {
          sVar15 = sVar14;
        }
        sVar17 = -sVar16;
        if (0 < sVar16) {
          sVar17 = sVar16;
        }
        if (MVar2 == '\x03') {
          iVar9 = (int)sVar17 + (int)sVar15 >> 3;
        }
        else if (MVar2 == '\x01') {
          iVar9 = (int)sVar17 + (int)sVar15 >> 2;
        }
        else if (MVar2 == '\0') {
          iVar9 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar16] +
                         (long)(ms_params->mv_cost_params).mvcost[0][sVar14] +
                        (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                      (ulong)((uint)(sVar25 != sVar4) * 4 +
                                             (uint)(sVar23 != sVar3) * 8))) *
                        (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
        }
      }
      paVar13 = (aom_variance_fn_ptr_t *)(ulong)(iVar9 + uVar20);
    }
  }
  return (int)paVar13;
}

Assistant:

int av1_obmc_full_pixel_search(const FULLPEL_MV start_mv,
                               const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                               const int step_param, FULLPEL_MV *best_mv) {
  if (!ms_params->fast_obmc_search) {
    const int bestsme =
        obmc_full_pixel_diamond(ms_params, start_mv, step_param, best_mv);
    return bestsme;
  } else {
    *best_mv = start_mv;
    clamp_fullmv(best_mv, &ms_params->mv_limits);
    int thissme = obmc_refining_search_sad(ms_params, best_mv);
    if (thissme < INT_MAX) thissme = get_obmc_mvpred_var(ms_params, best_mv);
    return thissme;
  }
}